

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result btree_find(btree *btree,void *key,void *value_buf)

{
  undefined2 uVar1;
  btree_print_func *pbVar2;
  code *pcVar3;
  undefined8 uVar4;
  short sVar5;
  void *pvVar6;
  void *pvVar7;
  idx_t iVar8;
  int iVar9;
  idx_t *piVar10;
  long lVar11;
  uint8_t *puVar12;
  bnode *pbVar13;
  undefined8 uStack_70;
  bnode *pbStack_68;
  uint local_5c;
  long lStack_58;
  int i;
  bnode **node;
  bid_t *bid;
  idx_t *idx;
  uint8_t *v;
  uint8_t *k;
  void *addr;
  void *value_buf_local;
  void *key_local;
  btree *btree_local;
  
  puVar12 = (uint8_t *)((long)&pbStack_68 - (ulong)(btree->ksize + 0xf & 0xfffffff0));
  piVar10 = (idx_t *)(puVar12 + -(ulong)(btree->vsize + 0xf & 0xfffffff0));
  bid = (bid_t *)((long)piVar10 - (ulong)(btree->height + 0xf + (uint)btree->height & 0xfffffff0));
  node = (bnode **)((long)bid - (ulong)((uint)btree->height * 8 + 0xf & 0xfffffff0));
  lVar11 = (long)node - (ulong)((uint)btree->height * 8 + 0xf & 0xfffffff0);
  lStack_58 = lVar11;
  idx = piVar10;
  v = puVar12;
  addr = value_buf;
  value_buf_local = key;
  key_local = btree;
  if (btree->kv_ops->init_kv_var != (btree_print_func *)0x0) {
    pbVar2 = btree->kv_ops->init_kv_var;
    *(undefined8 *)(lVar11 + -8) = 0x10db5c;
    (*pbVar2)(btree,puVar12,piVar10);
  }
  node[(int)(*(ushort *)((long)key_local + 2) - 1)] = *(bnode **)((long)key_local + 8);
  local_5c = (uint)*(ushort *)((long)key_local + 2);
  while( true ) {
    local_5c = local_5c - 1;
    if ((int)local_5c < 0) {
      if (*(long *)(*(long *)((long)key_local + 0x18) + 0x48) != 0) {
        pcVar3 = *(code **)(*(long *)((long)key_local + 0x18) + 0x48);
        uVar4 = *(undefined8 *)((long)key_local + 0x10);
        *(undefined8 *)(lVar11 + -8) = 0x10deb6;
        (*pcVar3)(uVar4);
      }
      pvVar6 = key_local;
      puVar12 = v;
      piVar10 = idx;
      if (*(long *)(*(long *)((long)key_local + 0x20) + 0x38) != 0) {
        pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x38);
        *(undefined8 *)(lVar11 + -8) = 0x10dedf;
        (*pcVar3)(pvVar6,puVar12,piVar10);
      }
      return BTREE_RESULT_SUCCESS;
    }
    pcVar3 = *(code **)(*(long *)((long)key_local + 0x18) + 0x18);
    uVar4 = *(undefined8 *)((long)key_local + 0x10);
    pbVar13 = node[(int)local_5c];
    *(undefined8 *)(lVar11 + -8) = 0x10dbb4;
    puVar12 = (uint8_t *)(*pcVar3)(uVar4,pbVar13);
    pvVar6 = key_local;
    sVar5 = (short)local_5c;
    k = puVar12;
    *(undefined8 *)(lVar11 + -8) = 0x10dbce;
    pbVar13 = _fetch_bnode((btree *)pvVar6,puVar12,sVar5 + 1);
    pvVar7 = key_local;
    pvVar6 = value_buf_local;
    *(bnode **)(lStack_58 + (long)(int)local_5c * 8) = pbVar13;
    pbVar13 = *(bnode **)(lStack_58 + (long)(int)local_5c * 8);
    *(undefined8 *)(lVar11 + -8) = 0x10dbf6;
    iVar8 = _btree_find_entry((btree *)pvVar7,pbVar13,pvVar6);
    puVar12 = v;
    piVar10 = idx;
    *(idx_t *)((long)bid + (long)(int)local_5c * 2) = iVar8;
    if (*(short *)((long)bid + (long)(int)local_5c * 2) == -1) break;
    pcVar3 = (code *)**(undefined8 **)((long)key_local + 0x20);
    uVar4 = *(undefined8 *)(lStack_58 + (long)(int)local_5c * 8);
    uVar1 = *(undefined2 *)((long)bid + (long)(int)local_5c * 2);
    *(undefined8 *)(lVar11 + -8) = 0x10dca2;
    (*pcVar3)(uVar4,uVar1,puVar12,piVar10);
    pvVar6 = value_buf_local;
    puVar12 = v;
    piVar10 = idx;
    if ((int)local_5c < 1) {
      pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x60);
      uVar4 = *(undefined8 *)((long)key_local + 0x30);
      *(undefined8 *)(lVar11 + -8) = 0x10de07;
      iVar9 = (*pcVar3)(pvVar6,puVar12,uVar4);
      pvVar7 = key_local;
      pvVar6 = addr;
      piVar10 = idx;
      if (iVar9 != 0) {
        if (*(long *)(*(long *)((long)key_local + 0x18) + 0x48) != 0) {
          pcVar3 = *(code **)(*(long *)((long)key_local + 0x18) + 0x48);
          uVar4 = *(undefined8 *)((long)key_local + 0x10);
          *(undefined8 *)(lVar11 + -8) = 0x10de4d;
          (*pcVar3)(uVar4);
        }
        pvVar6 = key_local;
        puVar12 = v;
        piVar10 = idx;
        if (*(long *)(*(long *)((long)key_local + 0x20) + 0x38) != 0) {
          pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x38);
          *(undefined8 *)(lVar11 + -8) = 0x10de76;
          (*pcVar3)(pvVar6,puVar12,piVar10);
        }
        return BTREE_RESULT_FAIL;
      }
      pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x48);
      *(undefined8 *)(lVar11 + -8) = 0x10de26;
      (*pcVar3)(pvVar7,pvVar6,piVar10);
    }
    else {
      pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x68);
      *(undefined8 *)(lVar11 + -8) = 0x10dcbe;
      pbVar13 = (bnode *)(*pcVar3)(piVar10);
      node[(int)(local_5c - 1)] = pbVar13;
      node[(int)(local_5c - 1)] =
           (bnode *)((ulong)node[(int)(local_5c - 1)] >> 0x38 |
                     ((ulong)node[(int)(local_5c - 1)] & 0xff000000000000) >> 0x28 |
                     ((ulong)node[(int)(local_5c - 1)] & 0xff0000000000) >> 0x18 |
                     ((ulong)node[(int)(local_5c - 1)] & 0xff00000000) >> 8 |
                     ((ulong)node[(int)(local_5c - 1)] & 0xff000000) << 8 |
                     ((ulong)node[(int)(local_5c - 1)] & 0xff0000) << 0x18 |
                     ((ulong)node[(int)(local_5c - 1)] & 0xff00) << 0x28 |
                    (long)node[(int)(local_5c - 1)] << 0x38);
    }
  }
  if (*(long *)(*(long *)((long)key_local + 0x18) + 0x48) != 0) {
    pcVar3 = *(code **)(*(long *)((long)key_local + 0x18) + 0x48);
    uVar4 = *(undefined8 *)((long)key_local + 0x10);
    *(undefined8 *)(lVar11 + -8) = 0x10dc3d;
    (*pcVar3)(uVar4);
  }
  pvVar6 = key_local;
  puVar12 = v;
  piVar10 = idx;
  if (*(long *)(*(long *)((long)key_local + 0x20) + 0x38) != 0) {
    pcVar3 = *(code **)(*(long *)((long)key_local + 0x20) + 0x38);
    *(undefined8 *)(lVar11 + -8) = 0x10dc66;
    (*pcVar3)(pvVar6,puVar12,piVar10);
  }
  return BTREE_RESULT_FAIL;
}

Assistant:

btree_result btree_find(struct btree *btree, void *key, void *value_buf)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid = alca(bid_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i;

    if (btree->kv_ops->init_kv_var) btree->kv_ops->init_kv_var(btree, k, v);

    // set root
    bid[btree->height-1] = btree->root_bid;

    for (i=btree->height-1; i>=0; --i) {
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (idx[i] == BTREE_IDX_NOT_FOUND) {
            // not found .. return NULL
            if (btree->blk_ops->blk_operation_end)
                btree->blk_ops->blk_operation_end(btree->blk_handle);
            if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
            return BTREE_RESULT_FAIL;
        }

        btree->kv_ops->get_kv(node[i], idx[i], k, v);

        if (i>0) {
            // index (non-leaf) node
            // get bid of child node from value
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node
            // return (address of) value if KEY == k
            if (!btree->kv_ops->cmp(key, k, btree->aux)) {
                btree->kv_ops->set_value(btree, value_buf, v);
            }else{
                if (btree->blk_ops->blk_operation_end)
                    btree->blk_ops->blk_operation_end(btree->blk_handle);
                if (btree->kv_ops->free_kv_var) {
                    btree->kv_ops->free_kv_var(btree, k, v);
                }
                return BTREE_RESULT_FAIL;
            }
        }
    }
    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
    return BTREE_RESULT_SUCCESS;
}